

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<F3DFloor_*,_F3DFloor_*>::DoCopy
          (TArray<F3DFloor_*,_F3DFloor_*> *this,TArray<F3DFloor_*,_F3DFloor_*> *other)

{
  uint uVar1;
  F3DFloor **ppFVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (F3DFloor **)0x0;
  }
  else {
    ppFVar2 = (F3DFloor **)
              M_Malloc_Dbg((ulong)uVar1 << 3,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                           ,0x19e);
    this->Array = ppFVar2;
    uVar1 = this->Count;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      this->Array[uVar3] = other->Array[uVar3];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}